

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O1

int Mop_ManMergeDist1Pairs2(Mop_Man_t *p,Vec_Int_t *vGroup,Vec_Int_t *vGroupPrev)

{
  word *__s1;
  int Entry;
  uint uVar1;
  word *pwVar2;
  word *pwVar3;
  word *pwVar4;
  int *piVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  long local_50;
  
  uVar19 = (ulong)(uint)vGroup->nSize;
  if (vGroup->nSize < 1) {
    iVar9 = 0;
  }
  else {
    lVar14 = 0;
    local_50 = 1;
    iVar9 = 0;
    do {
      iVar18 = vGroup->pArray[lVar14];
      if (iVar18 != -1) {
        uVar16 = p->nWordsIn * iVar18;
        if (((int)uVar16 < 0) || (p->vWordsIn->nSize <= (int)uVar16)) {
LAB_003365ac:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        if (lVar14 + 1 < (long)vGroup->nSize) {
          pwVar2 = p->vWordsIn->pArray;
          lVar21 = local_50;
LAB_0033625b:
          Entry = vGroup->pArray[lVar21];
          if (Entry == -1) goto LAB_00336508;
          uVar1 = p->nWordsIn;
          uVar19 = (ulong)uVar1;
          uVar11 = uVar1 * Entry;
          if (((int)uVar11 < 0) || (p->vWordsIn->nSize <= (int)uVar11)) goto LAB_003365ac;
          if ((int)uVar1 < 1) goto LAB_00336508;
          pwVar3 = p->vWordsIn->pArray;
          uVar20 = 0;
          bVar22 = false;
          do {
            bVar6 = false;
            if (pwVar2[uVar16 + uVar20] != pwVar3[uVar11 + uVar20]) {
              uVar13 = pwVar3[uVar11 + uVar20] ^ pwVar2[uVar16 + uVar20];
              bVar6 = true;
              if (((((uVar13 >> 1 ^ uVar13) & 0x5555555555555555) == 0) &&
                  (uVar13 = uVar13 & 0x5555555555555555 & uVar13 >> 1, uVar13 != 0)) &&
                 (bVar7 = !bVar22, bVar22 = true, bVar7)) {
                uVar13 = (uVar13 >> 2 & 0x3333333333333333) + (uVar13 & 0x3333333333333333);
                bVar22 = ((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38 <
                         2;
                bVar6 = !bVar22;
              }
            }
            if (bVar6) {
              bVar22 = false;
              break;
            }
            uVar20 = uVar20 + 1;
          } while (uVar19 != uVar20);
          if (!bVar22) goto LAB_00336508;
          uVar1 = p->nWordsOut;
          lVar15 = (long)(int)uVar1;
          uVar17 = uVar1 * iVar18;
          if (-1 < (int)uVar17) {
            iVar8 = p->vWordsOut->nSize;
            if ((((int)uVar17 < iVar8) && (uVar12 = uVar1 * Entry, -1 < (int)uVar12)) &&
               ((int)uVar12 < iVar8)) {
              pwVar4 = p->vWordsOut->pArray;
              __s1 = pwVar4 + uVar17;
              pwVar4 = pwVar4 + uVar12;
              iVar8 = bcmp(__s1,pwVar4,lVar15 * 8);
              if (iVar8 == 0) {
                __assert_fail("memcmp(pCube1Out, pCube2Out, sizeof(word)*p->nWordsOut)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                              ,0x226,
                              "int Mop_ManMergeDist1Pairs2(Mop_Man_t *, Vec_Int_t *, Vec_Int_t *)");
              }
              if (0 < (int)uVar1) {
                lVar10 = 0;
                do {
                  if ((pwVar4[lVar10] & ~__s1[lVar10]) != 0) {
                    if ((int)uVar1 < 1) goto LAB_00336485;
                    lVar10 = 0;
                    goto LAB_0033646b;
                  }
                  lVar10 = lVar10 + 1;
                } while (lVar15 != lVar10);
              }
              uVar20 = 0;
              do {
                pwVar3[uVar11 + uVar20] = pwVar3[uVar11 + uVar20] & pwVar2[uVar16 + uVar20];
                uVar20 = uVar20 + 1;
              } while (uVar19 != uVar20);
              if (0 < (int)uVar1) {
                lVar10 = 0;
                do {
                  __s1[lVar10] = __s1[lVar10] & ~pwVar4[lVar10];
                  lVar10 = lVar10 + 1;
                } while (lVar15 != lVar10);
              }
              Vec_IntPush(vGroupPrev,Entry);
              lVar15 = lVar21;
              if (lVar21 < vGroup->nSize) goto LAB_003364e8;
              goto LAB_003365cb;
            }
          }
          goto LAB_003365ac;
        }
      }
LAB_0033653a:
      lVar14 = lVar14 + 1;
      uVar19 = (ulong)vGroup->nSize;
      local_50 = local_50 + 1;
    } while (lVar14 < (long)uVar19);
  }
  iVar18 = (int)uVar19;
  if (iVar9 != 0) {
    if (iVar18 < 1) {
      uVar16 = 0;
    }
    else {
      piVar5 = vGroup->pArray;
      lVar14 = 0;
      uVar16 = 0;
      do {
        iVar18 = piVar5[lVar14];
        if (iVar18 != -1) {
          if (((int)uVar16 < 0) || ((int)uVar19 <= (int)uVar16)) {
LAB_003365cb:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          uVar19 = (ulong)uVar16;
          uVar16 = uVar16 + 1;
          piVar5[uVar19] = iVar18;
        }
        lVar14 = lVar14 + 1;
        iVar18 = vGroup->nSize;
        uVar19 = (ulong)iVar18;
      } while (lVar14 < (long)uVar19);
    }
    if (iVar18 < (int)uVar16) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    vGroup->nSize = uVar16;
  }
  return iVar9;
  while (lVar10 = lVar10 + 1, lVar15 != lVar10) {
LAB_0033646b:
    if ((__s1[lVar10] & ~pwVar4[lVar10]) != 0) goto LAB_00336508;
  }
LAB_00336485:
  uVar20 = 0;
  do {
    pwVar2[uVar16 + uVar20] = pwVar2[uVar16 + uVar20] & pwVar3[uVar11 + uVar20];
    uVar20 = uVar20 + 1;
  } while (uVar19 != uVar20);
  if ((int)uVar1 < 2) {
    uVar1 = 1;
  }
  uVar19 = 0;
  do {
    pwVar4[uVar19] = pwVar4[uVar19] & ~__s1[uVar19];
    uVar19 = uVar19 + 1;
  } while (uVar1 != uVar19);
  Vec_IntPush(vGroupPrev,iVar18);
  lVar15 = lVar14;
  if (vGroup->nSize <= lVar14) goto LAB_003365cb;
LAB_003364e8:
  vGroup->pArray[lVar15] = -1;
  iVar9 = iVar9 + 1;
LAB_00336508:
  lVar21 = lVar21 + 1;
  if (vGroup->nSize <= (int)lVar21) goto LAB_0033653a;
  goto LAB_0033625b;
}

Assistant:

int Mop_ManMergeDist1Pairs2( Mop_Man_t * p, Vec_Int_t * vGroup, Vec_Int_t * vGroupPrev )
{
    int w, c1, c2, iCube1, iCube2, Count = 0;
    Vec_IntForEachEntry( vGroup, iCube1, c1 )
    if ( iCube1 != -1 )
    {
        word * pCube1Out, * pCube1 = Mop_ManCubeIn( p, iCube1 );
        Vec_IntForEachEntryStart( vGroup, iCube2, c2, c1+1 )
        if ( iCube2 != -1 )
        {
            word * pCube2Out, * pCube2 = Mop_ManCubeIn( p, iCube2 );
            if ( !Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn) )
                continue;
            pCube1Out = Mop_ManCubeOut( p, iCube1 );
            pCube2Out = Mop_ManCubeOut( p, iCube2 );
            assert( memcmp(pCube1Out, pCube2Out, sizeof(word)*p->nWordsOut) );
            if ( Mop_ManCheckContain(pCube1Out, pCube2Out, p->nWordsOut) ) // pCube1 has more outputs
            {
                // update the input part
                for ( w = 0; w < p->nWordsIn; w++ )
                    pCube2[w] &= pCube1[w];
                // sharp the output part
                for ( w = 0; w < p->nWordsOut; w++ )
                    pCube1Out[w] &= ~pCube2Out[w];
                // move to another group
                Vec_IntPush( vGroupPrev, iCube2 );
                Vec_IntWriteEntry( vGroup, c2, -1 );
                Count++;
            }
            else if ( Mop_ManCheckContain(pCube2Out, pCube1Out, p->nWordsOut) ) // pCube2 has more outputs
            {
                // update the input part
                for ( w = 0; w < p->nWordsIn; w++ )
                    pCube1[w] &= pCube2[w];
                // sharp the output part
                for ( w = 0; w < p->nWordsOut; w++ )
                    pCube2Out[w] &= ~pCube1Out[w];
                // move to another group
                Vec_IntPush( vGroupPrev, iCube1 );
                Vec_IntWriteEntry( vGroup, c1, -1 );
                Count++;
            }
        }
    }
    if ( Count )
        Map_ManGroupCompact( vGroup );
    return Count;
}